

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

double * r8vec_linspace_new(int n,double a_first,double a_last)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar4 = (ulong)(uint)n << 3;
  }
  pdVar1 = (double *)operator_new__(uVar4);
  if (n == 1) {
    *pdVar1 = (a_first + a_last) * 0.5;
  }
  else {
    iVar2 = n + -1;
    dVar5 = (double)iVar2;
    uVar3 = 0;
    uVar4 = (ulong)(uint)n;
    if (n < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      pdVar1[uVar3] = ((double)iVar2 * a_first + (double)(int)uVar3 * a_last) / dVar5;
      iVar2 = iVar2 + -1;
    }
  }
  return pdVar1;
}

Assistant:

double *r8vec_linspace_new ( int n, double a_first, double a_last )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_LINSPACE_NEW creates a vector of linearly spaced values.
//
//  Discussion:
//
//    An R8VEC is a vector of R8's.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 March 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double A_FIRST, A_LAST, the first and last entries.
//
//    Output, double R8VEC_LINSPACE_NEW[N], a vector of linearly spaced data.
//
{
  double *a;
  int i;

  a = new double[n];

  if ( n == 1 )
  {
    a[0] = ( a_first + a_last ) / 2.0;
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      a[i] = ( double( n - 1 - i ) * a_first 
             + double(         i ) * a_last ) 
             / double( n - 1     );
    }
  }
  return a;
}